

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall cmFindLibraryHelper::RegexFromList(cmFindLibraryHelper *this,string *out,cmList *in)

{
  bool bVar1;
  reference in_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end1;
  const_iterator __begin1;
  cmList *__range1;
  char *sep;
  cmList *in_local;
  string *out_local;
  cmFindLibraryHelper *this_local;
  
  std::__cxx11::string::operator+=((string *)out,"(");
  __range1 = (cmList *)0x1193827;
  __end1 = cmList::begin_abi_cxx11_(in);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      cmList::end_abi_cxx11_(in);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&s);
    if (!bVar1) break;
    in_00 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)out,(char *)__range1);
    __range1 = (cmList *)0x115309d;
    RegexFromLiteral(this,out,in_00);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)out,")");
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromList(std::string& out, cmList const& in)
{
  // Surround the list in parens so the '|' does not apply to anything
  // else and the result can be checked after matching.
  out += "(";
  const char* sep = "";
  for (auto const& s : in) {
    // Separate from previous item.
    out += sep;
    sep = "|";

    // Append this item.
    this->RegexFromLiteral(out, s);
  }
  out += ")";
}